

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_member_location
          (CompilerMSL *this,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  bool bVar1;
  uint32_t uVar2;
  
  if (comp != (uint32_t *)0x0) {
    bVar1 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)type_id,index,DecorationComponent);
    if (bVar1) {
      uVar2 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)type_id,index,DecorationComponent);
    }
    else {
      uVar2 = 0xffffffff;
    }
    *comp = uVar2;
  }
  bVar1 = Compiler::has_member_decoration((Compiler *)this,(TypeID)type_id,index,DecorationLocation)
  ;
  if (bVar1) {
    uVar2 = Compiler::get_member_decoration
                      ((Compiler *)this,(TypeID)type_id,index,DecorationLocation);
    return uVar2;
  }
  return 0xffffffff;
}

Assistant:

uint32_t CompilerMSL::get_member_location(uint32_t type_id, uint32_t index, uint32_t *comp) const
{
	if (comp)
	{
		if (has_member_decoration(type_id, index, DecorationComponent))
			*comp = get_member_decoration(type_id, index, DecorationComponent);
		else
			*comp = k_unknown_component;
	}

	if (has_member_decoration(type_id, index, DecorationLocation))
		return get_member_decoration(type_id, index, DecorationLocation);
	else
		return k_unknown_location;
}